

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  char *end;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"0",&local_41);
  bVar1 = cmExpandedCommandArgument::operator==(arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,"1",&local_41);
    bVar1 = cmExpandedCommandArgument::operator==(arg,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      return true;
    }
    pcVar2 = cmExpandedCommandArgument::c_str(arg);
    bVar1 = cmSystemTools::IsOn(pcVar2);
    if (bVar1) {
      return true;
    }
    pcVar2 = cmExpandedCommandArgument::c_str(arg);
    bVar1 = cmSystemTools::IsOff(pcVar2);
    if (!bVar1) {
      bVar1 = cmExpandedCommandArgument::empty(arg);
      if (!bVar1) {
        pcVar2 = cmExpandedCommandArgument::c_str(arg);
        dVar3 = strtod(pcVar2,(char **)&local_40);
        if (*local_40._M_dataplus._M_p == '\0') {
          return (bool)(-(dVar3 != 0.0) & 1);
        }
      }
      pcVar2 = GetDefinitionIfUnquoted(this,arg);
      bVar1 = cmSystemTools::IsOff(pcVar2);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0") {
    return false;
  }
  if (arg == "1") {
    return true;
  }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str())) {
    return true;
  }
  if (cmSystemTools::IsOff(arg.c_str())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}